

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImVec2 pos;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    id = GImGui->ActiveIdWindow->MoveId;
    if (id != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(id);
    if ((pIVar2->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  if ((pIVar2->MovingWindow == (ImGuiWindow *)0x0) ||
     (window = pIVar2->MovingWindow->RootWindow, window == (ImGuiWindow *)0x0)) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xda7,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar2->IO).MouseDown[0] != true) ||
     (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos), !bVar3)) {
    ClearActiveID();
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  auVar4._8_8_ = 0;
  auVar4._0_4_ = (pIVar2->IO).MousePos.x;
  auVar4._4_4_ = (pIVar2->IO).MousePos.y;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = (pIVar2->ActiveIdClickOffset).x;
  auVar5._4_4_ = (pIVar2->ActiveIdClickOffset).y;
  auVar4 = vsubps_avx(auVar4,auVar5);
  pos = (ImVec2)vmovlps_avx(auVar4);
  fVar1 = (window->Pos).x;
  if ((fVar1 == auVar4._0_4_) && (!NAN(fVar1) && !NAN(auVar4._0_4_))) {
    fVar1 = (window->Pos).y;
    auVar4 = vmovshdup_avx(auVar4);
    if ((fVar1 == auVar4._0_4_) && (!NAN(fVar1) && !NAN(auVar4._0_4_))) goto LAB_001466da;
  }
  MarkIniSettingsDirty(window);
  SetWindowPos(window,&pos,1);
LAB_001466da:
  FocusWindow(pIVar2->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}